

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectwriter.cc
# Opt level: O2

void __thiscall
google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::WriteAny(AnyWriter *this)

{
  ProtoStreamObjectWriter *this_00;
  string *psVar1;
  stringpiece_ssize_type sVar2;
  StringPiece value;
  char *local_b8;
  undefined8 local_b0;
  AlphaNum local_88;
  string local_58;
  StringPiece local_38;
  
  if ((this->ow_)._M_t.
      super___uniq_ptr_impl<google::protobuf::util::converter::ProtoStreamObjectWriter,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter>_>
      ._M_t.
      super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter>_>
      .super__Head_base<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_false>.
      _M_head_impl == (ProtoStreamObjectWriter *)0x0) {
    if (((this->uninterpreted_events_).
         super__Vector_base<google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::Event,_std::allocator<google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::Event>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         (this->uninterpreted_events_).
         super__Vector_base<google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::Event,_std::allocator<google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::Event>_>
         ._M_impl.super__Vector_impl_data._M_finish) && (this->invalid_ == false)) {
      this_00 = this->parent_;
      StringPiece::StringPiece(&local_38,"Any");
      local_b8 = "Missing @type for any field in ";
      local_b0 = 0x1f;
      psVar1 = (this->parent_->master_type_->name_).ptr_;
      local_88.piece_data_ = (psVar1->_M_dataplus)._M_p;
      local_88.piece_size_ = psVar1->_M_string_length;
      StrCat_abi_cxx11_(&local_58,(protobuf *)&local_b8,&local_88,(AlphaNum *)local_88.piece_data_);
      sVar2 = StringPiece::CheckedSsizeTFromSizeT(local_58._M_string_length);
      value.length_ = sVar2;
      value.ptr_ = local_58._M_dataplus._M_p;
      ProtoWriter::InvalidValue(&this_00->super_ProtoWriter,local_38,value);
      std::__cxx11::string::~string((string *)&local_58);
      this->invalid_ = true;
    }
  }
  else {
    protobuf::internal::WireFormatLite::WriteString
              (1,&this->type_url_,
               (this->parent_->super_ProtoWriter).stream_._M_t.
               super___uniq_ptr_impl<google::protobuf::io::CodedOutputStream,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::io::CodedOutputStream_*,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
               .super__Head_base<0UL,_google::protobuf::io::CodedOutputStream_*,_false>._M_head_impl
              );
    if ((this->data_)._M_string_length != 0) {
      protobuf::internal::WireFormatLite::WriteBytes
                (2,&this->data_,
                 (this->parent_->super_ProtoWriter).stream_._M_t.
                 super___uniq_ptr_impl<google::protobuf::io::CodedOutputStream,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::io::CodedOutputStream_*,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
                 .super__Head_base<0UL,_google::protobuf::io::CodedOutputStream_*,_false>.
                 _M_head_impl);
      return;
    }
  }
  return;
}

Assistant:

void ProtoStreamObjectWriter::AnyWriter::WriteAny() {
  if (ow_ == nullptr) {
    if (uninterpreted_events_.empty()) {
      // We never got any content, so just return immediately, which is
      // equivalent to writing an empty Any.
      return;
    } else {
      // There are uninterpreted data, but we never got a "@type" field.
      if (!invalid_) {
        parent_->InvalidValue("Any",
                              StrCat("Missing @type for any field in ",
                                           parent_->master_type_.name()));
        invalid_ = true;
      }
      return;
    }
  }
  // Render the type_url and value fields directly to the stream.
  // type_url has tag 1 and value has tag 2.
  WireFormatLite::WriteString(1, type_url_, parent_->stream());
  if (!data_.empty()) {
    WireFormatLite::WriteBytes(2, data_, parent_->stream());
  }
}